

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

void ImfHeaderDataWindow(ImfHeader *hdr,int *xMin,int *yMin,int *xMax,int *yMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Box2i *pBVar4;
  
  pBVar4 = Imf_3_4::Header::dataWindow((Header *)hdr);
  iVar1 = (pBVar4->min).y;
  iVar2 = (pBVar4->max).x;
  iVar3 = (pBVar4->max).y;
  *xMin = (pBVar4->min).x;
  *yMin = iVar1;
  *xMax = iVar2;
  *yMax = iVar3;
  return;
}

Assistant:

void
ImfHeaderDataWindow (
    const ImfHeader* hdr, int* xMin, int* yMin, int* xMax, int* yMax)
{
    const Box2i dw = header (hdr)->dataWindow ();
    *xMin          = dw.min.x;
    *yMin          = dw.min.y;
    *xMax          = dw.max.x;
    *yMax          = dw.max.y;
}